

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decallib.cpp
# Opt level: O0

void __thiscall FDecalLib::ParseDecalGroup(FDecalLib *this,FScanner *sc)

{
  bool bVar1;
  WORD WVar2;
  FDecalGroup *this_00;
  FDecalBase *decal;
  FDecalGroup *group;
  FDecalBase *targetDecal;
  WORD decalNum;
  FString groupName;
  FScanner *sc_local;
  FDecalLib *this_local;
  
  groupName.Chars = (char *)sc;
  FString::FString((FString *)&stack0xffffffffffffffe0);
  FScanner::MustGetString((FScanner *)groupName.Chars);
  FString::operator=((FString *)&stack0xffffffffffffffe0,*groupName.Chars);
  WVar2 = GetDecalID(this,(FScanner *)groupName.Chars);
  FScanner::MustGetStringName((FScanner *)groupName.Chars,"{");
  this_00 = (FDecalGroup *)operator_new(0x40);
  FDecalGroup::FDecalGroup(this_00);
  while( true ) {
    FScanner::MustGetString((FScanner *)groupName.Chars);
    bVar1 = FScanner::Compare((FScanner *)groupName.Chars,"}");
    if (bVar1) break;
    decal = ScanTreeForName(*groupName.Chars,this->Root);
    if (decal == (FDecalBase *)0x0) {
      FScanner::ScriptError
                ((FScanner *)groupName.Chars,"%s has not been defined",
                 *(undefined8 *)groupName.Chars);
    }
    FScanner::MustGetNumber((FScanner *)groupName.Chars);
    FDecalGroup::AddDecal(this_00,decal,*(WORD *)(groupName.Chars + 0x10));
  }
  FName::operator=(&(this_00->super_FDecalBase).Name,(FString *)&stack0xffffffffffffffe0);
  (this_00->super_FDecalBase).SpawnID = WVar2;
  AddDecal(this,(FDecalBase *)this_00);
  FString::~FString((FString *)&stack0xffffffffffffffe0);
  return;
}

Assistant:

void FDecalLib::ParseDecalGroup (FScanner &sc)
{
	FString groupName;
	WORD decalNum;
	FDecalBase *targetDecal;
	FDecalGroup *group;

	sc.MustGetString ();
	groupName = sc.String;
	decalNum = GetDecalID (sc);
	sc.MustGetStringName ("{");

	group = new FDecalGroup;

	for (;;)
	{
		sc.MustGetString ();
		if (sc.Compare ("}"))
		{
			group->Name = groupName;
			group->SpawnID = decalNum;
			AddDecal (group);
			break;
		}

		targetDecal = ScanTreeForName (sc.String, Root);
		if (targetDecal == NULL)
		{
			sc.ScriptError ("%s has not been defined", sc.String);
		}
		sc.MustGetNumber ();

		group->AddDecal (targetDecal, sc.Number);
	}
}